

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

int64_t anon_unknown.dwarf_54919::GetSourceSampleOffset
                  (ALsource *Source,ALCcontext *context,nanoseconds *clocktime)

{
  uint uVar1;
  ALCdevice *pAVar2;
  element_type pVVar3;
  ulong uVar4;
  __pointer_type pBVar5;
  ulong uVar6;
  
  pAVar2 = (context->mDevice).mPtr;
  do {
    while( true ) {
      do {
        uVar1 = (pAVar2->MixCount).super___atomic_base<unsigned_int>._M_i;
      } while ((uVar1 & 1) != 0);
      clocktime->__r =
           ((ulong)pAVar2->SamplesDone * 1000000000) / (ulong)pAVar2->Frequency +
           (pAVar2->ClockBase).__r;
      if (((ulong)Source->VoiceIdx <
           (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i) &&
         (pVVar3 = (&((context->mVoices)._M_b._M_p)->field_1)[Source->VoiceIdx].mArray[0],
         (pVVar3->mSourceID).super___atomic_base<unsigned_int>._M_i == Source->id)) break;
      Source->VoiceIdx = 0xffffffff;
      if (uVar1 == (pAVar2->MixCount).super___atomic_base<unsigned_int>._M_i) {
        return 0;
      }
    }
  } while (uVar1 != (pAVar2->MixCount).super___atomic_base<unsigned_int>._M_i);
  uVar6 = (ulong)(pVVar3->mPositionFrac).super___atomic_base<unsigned_int>._M_i << 0x14 |
          (ulong)(pVVar3->mPosition).super___atomic_base<unsigned_int>._M_i << 0x20;
  for (pBVar5 = Source->queue;
      (pBVar5 != (__pointer_type)0x0 && (pBVar5 != (pVVar3->mCurrentBuffer)._M_b._M_p));
      pBVar5 = (pBVar5->mNext)._M_b._M_p) {
    uVar6 = ((ulong)pBVar5->mSampleLen << 0x20) + uVar6;
  }
  uVar4 = 0x7fffffffffffffff;
  if (uVar6 < 0x7fffffffffffffff) {
    uVar4 = uVar6;
  }
  return uVar4;
}

Assistant:

int64_t GetSourceSampleOffset(ALsource *Source, ALCcontext *context, nanoseconds *clocktime)
{
    ALCdevice *device{context->mDevice.get()};
    const BufferlistItem *Current{};
    uint64_t readPos{};
    ALuint refcount;
    Voice *voice;

    do {
        refcount = device->waitForMix();
        *clocktime = GetDeviceClockTime(device);
        voice = GetSourceVoice(Source, context);
        if(voice)
        {
            Current = voice->mCurrentBuffer.load(std::memory_order_relaxed);

            readPos  = uint64_t{voice->mPosition.load(std::memory_order_relaxed)} << 32;
            readPos |= uint64_t{voice->mPositionFrac.load(std::memory_order_relaxed)} <<
                       (32-MixerFracBits);
        }
        std::atomic_thread_fence(std::memory_order_acquire);
    } while(refcount != device->MixCount.load(std::memory_order_relaxed));

    if(!voice)
        return 0;

    const BufferlistItem *BufferList{Source->queue};
    while(BufferList && BufferList != Current)
    {
        readPos += uint64_t{BufferList->mSampleLen} << 32;
        BufferList = BufferList->mNext.load(std::memory_order_relaxed);
    }
    return static_cast<int64_t>(minu64(readPos, 0x7fffffffffffffff_u64));
}